

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  GLFWwindow *handle;
  int iVar1;
  GLint maxTextureSize;
  
  glfwSetErrorCallback(Error);
  glfwInit();
  iVar1 = 0;
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar1 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    glGetString(0x1f02);
    glGetString(0x1f00);
    glGetString(0x1f03);
    glGetString(0x1f01);
    glGetString(0x8b8c);
    glGetIntegerv(0xd33);
    glfwDestroyWindow(handle);
    glfwTerminate();
  }
  return iVar1;
}

Assistant:

int
main(int argc, char **argv)
{
   glfwSetErrorCallback(&Error);

   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

   window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
   if (!window) {
      return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   glGetString(GL_VERSION);
   glGetString(GL_VENDOR);
   glGetString(GL_EXTENSIONS);
   glGetString(GL_RENDERER);
   glGetString(GL_SHADING_LANGUAGE_VERSION);
   GLint maxTextureSize = 0;
   glGetIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}